

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

bool charmap_HasChar(char *input)

{
  long lVar1;
  size_t next;
  Charnode *node;
  Charmap *charmap;
  char *input_local;
  
  next = (size_t)(*currentCharmap + 1);
  charmap = (Charmap *)input;
  while( true ) {
    if (*(char *)&charmap->name == '\0') {
      return (bool)(*(byte *)next & 1);
    }
    lVar1 = *(long *)(next + 8 + (long)(*(char *)&charmap->name + -1) * 8);
    if (lVar1 == 0) break;
    next = (long)*currentCharmap + lVar1 * 0x800 + 0x18;
    charmap = (Charmap *)((long)&charmap->name + 1);
  }
  return false;
}

Assistant:

bool charmap_HasChar(char const *input)
{
	struct Charmap const *charmap = *currentCharmap;
	struct Charnode const *node = &charmap->nodes[0];

	for (; *input; input++) {
		size_t next = node->next[*input - 1];

		if (!next)
			return false;
		node = &charmap->nodes[next];
	}

	return node->isTerminal;
}